

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O0

double ON_ArrayDistance(int dim,double *A,double *B)

{
  double dVar1;
  double dVar2;
  double local_40;
  double len;
  double c;
  double b;
  double a;
  double *B_local;
  double *A_local;
  int dim_local;
  
  if (dim == 1) {
    local_40 = ABS(*B - *A);
  }
  else if (dim == 2) {
    local_40 = ABS(*B - *A);
    dVar1 = ABS(B[1] - A[1]);
    if (local_40 <= dVar1) {
      if (dVar1 <= local_40) {
        local_40 = local_40 * 1.4142135623730951;
      }
      else {
        local_40 = sqrt((local_40 / dVar1) * (local_40 / dVar1) + 1.0);
        local_40 = dVar1 * local_40;
      }
    }
    else {
      dVar1 = sqrt((dVar1 / local_40) * (dVar1 / local_40) + 1.0);
      local_40 = local_40 * dVar1;
    }
  }
  else if (dim == 3) {
    local_40 = ABS(*B - *A);
    dVar1 = ABS(B[1] - A[1]);
    dVar2 = ABS(B[2] - A[2]);
    if (local_40 < dVar1) {
      if (dVar1 < dVar2) {
        local_40 = sqrt((local_40 / dVar2) * (local_40 / dVar2) + (dVar1 / dVar2) * (dVar1 / dVar2)
                        + 1.0);
        local_40 = dVar2 * local_40;
      }
      else {
        local_40 = sqrt((local_40 / dVar1) * (local_40 / dVar1) + (dVar2 / dVar1) * (dVar2 / dVar1)
                        + 1.0);
        local_40 = dVar1 * local_40;
      }
    }
    else if (local_40 < dVar2) {
      local_40 = sqrt((local_40 / dVar2) * (local_40 / dVar2) + (dVar1 / dVar2) * (dVar1 / dVar2) +
                      1.0);
      local_40 = dVar2 * local_40;
    }
    else if ((local_40 != 0.0) || (NAN(local_40))) {
      if ((local_40 != dVar1) || ((local_40 != dVar2 || (NAN(local_40) || NAN(dVar2))))) {
        dVar1 = sqrt((dVar1 / local_40) * (dVar1 / local_40) +
                     (dVar2 / local_40) * (dVar2 / local_40) + 1.0);
        local_40 = local_40 * dVar1;
      }
      else {
        local_40 = local_40 * 1.7320508075688772;
      }
    }
    else {
      local_40 = 0.0;
    }
  }
  else {
    local_40 = 0.0;
    a = (double)B;
    B_local = A;
    A_local._4_4_ = dim;
    while (A_local._4_4_ != 0) {
      local_40 = (*(double *)a - *B_local) * (*(double *)a - *B_local) + local_40;
      a = (double)((long)a + 8);
      B_local = B_local + 1;
      A_local._4_4_ = A_local._4_4_ + -1;
    }
    local_40 = sqrt(local_40);
  }
  return local_40;
}

Assistant:

double ON_ArrayDistance(int dim, const double *A, const double *B)
{
  // returns sqrt((A-B)o(A-B))
  double a, b, c, len;
  switch(dim) {
  case 1:
    len = fabs(*B - *A); 
    break;
  case 2:
    a = fabs(*B++ - *A++); b = fabs(*B - *A);
    if (a > b) 
      {b /= a; len = a*sqrt(1.0+b*b);}
    else if (b > a) 
      {a /= b; len = b*sqrt(1.0+a*a);}
    else
      len = a*ON_SQRT2;
    break;
  case 3:
    a = fabs(*B++ - *A++); b = fabs(*B++ - *A++); c = fabs(*B - *A);
    if (a >= b) {
      if (a >= c) {
        if      (a == 0.0)         len = 0.0;
        else if (a == b && a == c) len = a*ON_SQRT3;
        else      {b /= a; c /= a; len = a*sqrt(1.0 + (b*b + c*c));}
      }
      else 
        {a /= c; b /= c; len = c*sqrt(1.0 + (a*a + b*b));}
    }
    else if (b >= c) 
      {a /= b; c /= b; len = b*sqrt(1.0 + (a*a + c*c));}
    else 
      {b /= c; a /= c; len = c*sqrt(1.0 + (a*a + b*b));}
    break;
  default:
    len = 0.0;
    while (dim--) {a = *B++ - *A++; len += a*a;}
    len = sqrt(len);
    break;
  }
  return len;
}